

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAResult(USHAContext *ctx,uint8_t *Message_Digest)

{
  uint8_t *Message_Digest_local;
  USHAContext *ctx_local;
  
  if (ctx == (USHAContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    switch(ctx->whichSha) {
    case 0:
      ctx_local._4_4_ = SHA1Result(&(ctx->ctx).sha1Context,Message_Digest);
      break;
    case 1:
      ctx_local._4_4_ = SHA224Result(&(ctx->ctx).sha224Context,Message_Digest);
      break;
    case 2:
      ctx_local._4_4_ = SHA256Result(&(ctx->ctx).sha256Context,Message_Digest);
      break;
    case 3:
      ctx_local._4_4_ = SHA384Result(&(ctx->ctx).sha384Context,Message_Digest);
      break;
    case 4:
      ctx_local._4_4_ = SHA512Result(&(ctx->ctx).sha512Context,Message_Digest);
      break;
    default:
      ctx_local._4_4_ = 4;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int USHAResult(USHAContext *ctx,
    uint8_t Message_Digest[USHAMaxHashSize])
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1Result((SHA1Context*)&ctx->ctx, Message_Digest);
        case SHA224:
            return SHA224Result((SHA224Context*)&ctx->ctx, Message_Digest);
        case SHA256:
            return SHA256Result((SHA256Context*)&ctx->ctx, Message_Digest);
        case SHA384:
            return SHA384Result((SHA384Context*)&ctx->ctx, Message_Digest);
        case SHA512:
            return SHA512Result((SHA512Context*)&ctx->ctx, Message_Digest);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}